

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,AffineSpace3fa *xfm,Ref<embree::SceneGraph::Node> *child)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar10;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__TransformNode_002a0598;
  uVar2 = *(undefined8 *)&(xfm->l).vx.field_0;
  uVar3 = *(undefined8 *)((long)&(xfm->l).vx.field_0 + 8);
  uVar4 = *(undefined8 *)&(xfm->l).vy.field_0;
  uVar5 = *(undefined8 *)((long)&(xfm->l).vy.field_0 + 8);
  uVar6 = *(undefined8 *)&(xfm->l).vz.field_0;
  uVar7 = *(undefined8 *)((long)&(xfm->l).vz.field_0 + 8);
  uVar8 = *(undefined8 *)&(xfm->p).field_0;
  uVar9 = *(undefined8 *)((long)&(xfm->p).field_0 + 8);
  (this->spaces).time_range.lower = 0.0;
  (this->spaces).time_range.upper = 1.0;
  (this->spaces).spaces.size_active = 0;
  (this->spaces).spaces.size_alloced = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.size_alloced + 1) = 0;
  *(undefined8 *)((long)&(this->spaces).spaces.items + 1) = 0;
  pAVar10 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(0x40,0x10);
  (this->spaces).spaces.items = pAVar10;
  alignedFree((void *)0x0);
  (this->spaces).spaces.size_alloced = 1;
  pAVar10 = (this->spaces).spaces.items;
  (this->spaces).spaces.size_active = 1;
  *(undefined8 *)&(pAVar10->l).vx.field_0 = uVar2;
  *(undefined8 *)((long)&(pAVar10->l).vx.field_0 + 8) = uVar3;
  *(undefined8 *)&(pAVar10->l).vy.field_0 = uVar4;
  *(undefined8 *)((long)&(pAVar10->l).vy.field_0 + 8) = uVar5;
  *(undefined8 *)&(pAVar10->l).vz.field_0 = uVar6;
  *(undefined8 *)((long)&(pAVar10->l).vz.field_0 + 8) = uVar7;
  local_58 = (float)uVar8;
  fStack_54 = (float)((ulong)uVar8 >> 0x20);
  fStack_50 = (float)uVar9;
  fStack_4c = (float)((ulong)uVar9 >> 0x20);
  (pAVar10->p).field_0.m128[0] = local_58;
  (pAVar10->p).field_0.m128[1] = fStack_54;
  (pAVar10->p).field_0.m128[2] = fStack_50;
  (pAVar10->p).field_0.m128[3] = fStack_4c;
  pNVar1 = child->ptr;
  (this->child).ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
  }
  return;
}

Assistant:

TransformNode (const AffineSpace3fa& xfm, const Ref<Node>& child)
        : spaces((AffineSpace3ff)xfm), child(child) {}